

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O0

void __thiscall sc_core::sc_vector_base::context_scope::~context_scope(context_scope *this)

{
  sc_simcontext *this_00;
  sc_object *msg;
  sc_object *psVar1;
  sc_object_manager *in_RDI;
  sc_object *obj;
  char *in_stack_ffffffffffffffd8;
  
  if ((in_RDI->m_event_it)._M_node != (_Base_ptr)0x0) {
    this_00 = sc_object::simcontext((sc_object *)(in_RDI->m_event_it)._M_node);
    sc_simcontext::get_object_manager(this_00);
    msg = sc_object_manager::hierarchy_pop(in_RDI);
    psVar1 = sc_object::get_parent_object((sc_object *)(in_RDI->m_event_it)._M_node);
    if (msg != psVar1) {
      sc_assertion_failed((char *)msg,in_stack_ffffffffffffffd8,0);
    }
  }
  return;
}

Assistant:

sc_vector_base::context_scope::~context_scope()
{
  if (owner_) // restore current object context
  {
    sc_object* obj = owner_->simcontext()->get_object_manager()->hierarchy_pop();
    sc_assert( obj == owner_->get_parent_object() );
  }
}